

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_ThrowGrenade
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double dVar1;
  double dVar2;
  undefined8 *puVar3;
  void *pvVar4;
  AWeapon *this;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  double __x;
  double dVar8;
  double dVar9;
  PClass *pPVar10;
  int iVar11;
  uint uVar12;
  undefined4 extraout_var;
  PClass *pPVar13;
  AActor *missile;
  PClassActor *pPVar14;
  PClassActor *type;
  char *pcVar15;
  AActor *this_00;
  bool bVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  double dVar19;
  double dVar20;
  double dStack_60;
  DVector3 local_48;
  
  pPVar10 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
LAB_003d38ed:
    pcVar15 = "(paramnum) < numparam";
LAB_003d3906:
    __assert_fail(pcVar15,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xbb3,
                  "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_003d38e4:
    pcVar15 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
    goto LAB_003d3906;
  }
  this_00 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this_00 == (AActor *)0x0) goto LAB_003d3323;
    pPVar13 = (this_00->super_DThinker).super_DObject.Class;
    if (pPVar13 == (PClass *)0x0) {
      iVar11 = (**(this_00->super_DThinker).super_DObject._vptr_DObject)(this_00);
      pPVar13 = (PClass *)CONCAT44(extraout_var,iVar11);
      (this_00->super_DThinker).super_DObject.Class = pPVar13;
    }
    bVar16 = pPVar13 != (PClass *)0x0;
    if (pPVar13 != pPVar10 && bVar16) {
      do {
        pPVar13 = pPVar13->ParentClass;
        bVar16 = pPVar13 != (PClass *)0x0;
        if (pPVar13 == pPVar10) break;
      } while (pPVar13 != (PClass *)0x0);
    }
    if (!bVar16) {
      pcVar15 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_003d3906;
    }
  }
  else {
    if (this_00 != (AActor *)0x0) goto LAB_003d38e4;
LAB_003d3323:
    this_00 = (AActor *)0x0;
  }
  pPVar10 = AActor::RegistrationInfo.MyClass;
  if (numparam == 1) goto LAB_003d38ed;
  if (param[1].field_0.field_3.Type != '\x03') goto LAB_003d38e4;
  puVar3 = (undefined8 *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (puVar3 != (undefined8 *)0x0) {
      pPVar13 = (PClass *)puVar3[1];
      if (pPVar13 == (PClass *)0x0) {
        pPVar13 = (PClass *)(**(code **)*puVar3)(puVar3);
        puVar3[1] = pPVar13;
      }
      bVar16 = pPVar13 != (PClass *)0x0;
      if (pPVar13 != pPVar10 && bVar16) {
        do {
          pPVar13 = pPVar13->ParentClass;
          bVar16 = pPVar13 != (PClass *)0x0;
          if (pPVar13 == pPVar10) break;
        } while (pPVar13 != (PClass *)0x0);
      }
      if (!bVar16) {
        pcVar15 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_003d3906;
      }
    }
  }
  else if (puVar3 != (undefined8 *)0x0) goto LAB_003d38e4;
  if (numparam < 3) goto LAB_003d38ed;
  if (param[2].field_0.field_3.Type != '\x03') {
    pcVar15 = "param[paramnum].Type == REGT_POINTER";
    goto LAB_003d3906;
  }
  if (numparam == 3) {
    pcVar15 = "(paramnum) < numparam";
    goto LAB_003d3925;
  }
  if (param[3].field_0.field_3.Type != '\x03') {
LAB_003d38f6:
    pcVar15 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_003d3925:
    __assert_fail(pcVar15,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                  ,0xbb4,
                  "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pvVar4 = param[2].field_0.field_1.a;
  type = (PClassActor *)param[3].field_0.field_1.a;
  if (param[3].field_0.field_1.atag == 1) {
    if (type == (PClassActor *)0x0) goto LAB_003d3441;
    pPVar14 = type;
    if (type != (PClassActor *)AActor::RegistrationInfo.MyClass) {
      do {
        pPVar14 = (PClassActor *)(pPVar14->super_PClass).ParentClass;
        if (pPVar14 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
      } while (pPVar14 != (PClassActor *)0x0);
      if (pPVar14 == (PClassActor *)0x0) {
        pcVar15 = "missile == NULL || missile->IsDescendantOf(RUNTIME_CLASS(AActor))";
        goto LAB_003d3925;
      }
    }
    bVar16 = false;
  }
  else {
    if (type != (PClassActor *)0x0) goto LAB_003d38f6;
LAB_003d3441:
    bVar16 = true;
    type = (PClassActor *)0x0;
  }
  if (numparam < 5) {
    param = defaultparam->Array;
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar15 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d39b3;
    }
    dVar20 = param[4].field_0.f;
LAB_003d347f:
    if (param[5].field_0.field_3.Type != '\x01') {
      pcVar15 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003d39d2:
      __assert_fail(pcVar15,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xbb6,
                    "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    dVar19 = param[5].field_0.f;
LAB_003d3490:
    if (param[6].field_0.field_3.Type != '\x01') {
      pcVar15 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
LAB_003d3963:
      __assert_fail(pcVar15,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,2999,
                    "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    uVar17 = (undefined4)*(undefined8 *)&param[6].field_0;
    uVar18 = (undefined4)((ulong)*(undefined8 *)&param[6].field_0 >> 0x20);
LAB_003d34a1:
    if (param[7].field_0.field_3.Type != '\0') {
      pcVar15 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003d3944:
      __assert_fail(pcVar15,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,3000,
                    "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    if (param[4].field_0.field_3.Type != '\x01') {
      pcVar15 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003d39b3:
      __assert_fail(pcVar15,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xbb5,
                    "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    dVar20 = param[4].field_0.f;
    if (numparam == 5) {
      param = defaultparam->Array;
      goto LAB_003d347f;
    }
    if (param[5].field_0.field_3.Type != '\x01') {
      pcVar15 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d39d2;
    }
    dVar19 = param[5].field_0.f;
    if ((uint)numparam < 7) {
      param = defaultparam->Array;
      goto LAB_003d3490;
    }
    if (param[6].field_0.field_3.Type != '\x01') {
      pcVar15 = "(param[paramnum]).Type == REGT_FLOAT";
      goto LAB_003d3963;
    }
    uVar17 = (undefined4)*(undefined8 *)&param[6].field_0;
    uVar18 = (undefined4)((ulong)*(undefined8 *)&param[6].field_0 >> 0x20);
    if (numparam == 7) {
      param = defaultparam->Array;
      goto LAB_003d34a1;
    }
    if (param[7].field_0.field_3.Type != '\0') {
      pcVar15 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_003d3944;
    }
  }
  if (bVar16) {
    if (numret < 1) {
      return 0;
    }
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0xbbc,
                    "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
  }
  else {
    dVar9 = (double)CONCAT44(uVar18,uVar17);
    if ((pvVar4 == (void *)0x0 || this_00->player == (player_t *)0x0) ||
       (*(int *)((long)pvVar4 + 8) != 1)) {
LAB_003d3551:
      dVar1 = this_00->Floorclip;
      dVar7 = AActor::GetBobOffset(this_00,0.0);
      uVar17 = 0;
      uVar18 = 0;
      if (this_00->player != (player_t *)0x0) {
        dVar2 = this_00->player->crouchoffset;
        uVar17 = SUB84(dVar2,0);
        uVar18 = (undefined4)((ulong)dVar2 >> 0x20);
      }
      local_48.Z = dVar20 + (dVar7 - dVar1) + 35.0 + (double)CONCAT44(uVar18,uVar17) +
                   (this_00->__Pos).Z;
      local_48.X = (this_00->__Pos).X;
      local_48.Y = (this_00->__Pos).Y;
      missile = AActor::StaticSpawn(type,&local_48,ALLOW_REPLACE,false);
      if (missile == (AActor *)0x0) {
        if (numret < 1) {
          return 0;
        }
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0xbf4,
                        "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        uVar17 = 0;
        goto LAB_003d37eb;
      }
      P_PlaySpawnSound(missile,this_00);
      if ((dVar19 != 0.0) || (NAN(dVar19))) {
        missile->Speed = dVar19;
      }
      uVar12 = FRandom::GenRand32(&pr_grenade);
      dVar19 = (double)(int)((uVar12 & 7) - 4) * 1.40625 + (this_00->Angles).Yaw.Degrees;
      (missile->Angles).Yaw.Degrees = dVar19;
      auVar5._8_4_ = SUB84(missile->Speed,0);
      auVar5._0_8_ = dVar9;
      auVar5._12_4_ = (int)((ulong)missile->Speed >> 0x20);
      dVar1 = FFastTrig::cos(&fasttrig,dVar9);
      dVar20 = missile->Speed;
      dVar7 = FFastTrig::sin(&fasttrig,dVar20);
      dVar19 = FFastTrig::cos(&fasttrig,dVar19 * 11930464.711111112 + 6755399441055744.0);
      dVar2 = FFastTrig::sin(&fasttrig,dVar19);
      __x = FFastTrig::sin(&fasttrig,
                           (this_00->Angles).Pitch.Degrees * 11930464.711111112 + 6755399441055744.0
                          );
      dVar8 = FFastTrig::cos(&fasttrig,__x);
      dVar20 = dVar8 * dVar9 + dVar7 * dVar20;
      dVar7 = FFastTrig::cos(&fasttrig,dVar20);
      dVar8 = FFastTrig::sin(&fasttrig,dVar7);
      dStack_60 = auVar5._8_8_;
      dVar19 = (this_00->Vel).X * 0.5 + dVar1 * dStack_60 * dVar19 + dVar7 * __x * dVar9;
      dVar9 = (this_00->Vel).Y * 0.5 + __x * dVar9 * dVar8 + dVar2 * dVar1 * dStack_60;
      auVar6._8_4_ = SUB84(dVar9,0);
      auVar6._0_8_ = dVar19;
      auVar6._12_4_ = (int)((ulong)dVar9 >> 0x20);
      (missile->Vel).X = dVar19;
      (missile->Vel).Y = (double)auVar6._8_8_;
      (missile->Vel).Z = dVar20;
      (missile->target).field_0.p = this_00;
      P_CheckMissileSpawn(missile,this_00->radius);
      if (numret < 1) {
        return 0;
      }
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0xbf6,
                      "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
    }
    else {
      this = this_00->player->ReadyWeapon;
      if (this == (AWeapon *)0x0) {
        if (numret < 1) {
          return 0;
        }
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0xbc5,
                        "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      else {
        if ((param[7].field_0.i == 0) ||
           (bVar16 = AWeapon::DepleteAmmo(this,this->bAltFire,true,-1), bVar16)) goto LAB_003d3551;
        if (numret < 1) {
          return 0;
        }
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0xbc9,
                        "int AF_AActor_A_ThrowGrenade(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
    }
  }
  uVar17 = 1;
LAB_003d37eb:
  if (ret->RegType != '\0') {
    __assert_fail("RegType == REGT_INT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                  ,0x13f,"void VMReturn::SetInt(int)");
  }
  *(undefined4 *)ret->Location = uVar17;
  return 1;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ThrowGrenade)
{
		PARAM_ACTION_PROLOGUE(AActor);
	PARAM_CLASS		(missile, AActor);
		PARAM_FLOAT_DEF	(zheight)	
		PARAM_FLOAT_DEF	(xyvel)		
		PARAM_FLOAT_DEF	(zvel)		
		PARAM_BOOL_DEF	(useammo)	

	if (missile == NULL)
	{
		ACTION_RETURN_BOOL(true);
	}
	if (ACTION_CALL_FROM_PSPRITE())
	{
		// Used from a weapon, so use some ammo
		AWeapon *weapon = self->player->ReadyWeapon;

		if (weapon == NULL)
		{
			ACTION_RETURN_BOOL(true);
		}
		if (useammo && !weapon->DepleteAmmo(weapon->bAltFire))
		{
			ACTION_RETURN_BOOL(true);
		}
	}

	AActor *bo;

	bo = Spawn(missile, 
			self->PosPlusZ(-self->Floorclip + self->GetBobOffset() + zheight + 35 + (self->player? self->player->crouchoffset : 0.)),
			ALLOW_REPLACE);
	if (bo)
	{
		P_PlaySpawnSound(bo, self);
		if (xyvel != 0)
			bo->Speed = xyvel;
		bo->Angles.Yaw = self->Angles.Yaw + (((pr_grenade()&7) - 4) * (360./256.));

		DAngle pitch = -self->Angles.Pitch;
		DAngle angle = bo->Angles.Yaw;

		// There are two vectors we are concerned about here: xy and z. We rotate
		// them separately according to the shooter's pitch and then sum them to
		// get the final velocity vector to shoot with.

		double xy_xyscale = bo->Speed * pitch.Cos();
		double xy_velz = bo->Speed * pitch.Sin();
		double xy_velx = xy_xyscale * angle.Cos();
		double xy_vely = xy_xyscale * angle.Sin();

		pitch = self->Angles.Pitch;
		double z_xyscale = zvel * pitch.Sin();
		double z_velz = zvel * pitch.Cos();
		double z_velx = z_xyscale * angle.Cos();
		double z_vely = z_xyscale * angle.Sin();

		bo->Vel.X = xy_velx + z_velx + self->Vel.X / 2;
		bo->Vel.Y = xy_vely + z_vely + self->Vel.Y / 2;
		bo->Vel.Z = xy_velz + z_velz;

		bo->target = self;
		P_CheckMissileSpawn (bo, self->radius);
	} 
	else
	{
		ACTION_RETURN_BOOL(false);
	}
	ACTION_RETURN_BOOL(true);
}